

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLgraph.c
# Opt level: O1

void RDL_DFSvisit(RDL_graph *gra,uint vertex,char *visited)

{
  uint vertex_00;
  ulong uVar1;
  
  if (gra->degree[vertex] != 0) {
    uVar1 = 0;
    do {
      vertex_00 = gra->adjList[vertex][uVar1][0];
      if (visited[vertex_00] == '\0') {
        visited[vertex_00] = '\x01';
        RDL_DFSvisit(gra,vertex_00,visited);
      }
      uVar1 = uVar1 + 1;
    } while (uVar1 < gra->degree[vertex]);
  }
  return;
}

Assistant:

static void RDL_DFSvisit(const RDL_graph *gra, unsigned vertex, char *visited)
{
  unsigned i,j;
  for(i=0; i<gra->degree[vertex]; ++i)
  {
    j = gra->adjList[vertex][i][0];
    if(visited[j] == 0)
    {
      visited[j] = 1;
      RDL_DFSvisit(gra,j,visited);
    }
  }
}